

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5ec65::ParseCommandActions::actOnBindingDecl
          (ParseCommandActions *this,Token *name,Token *value)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  Token *local_20;
  Token *value_local;
  Token *name_local;
  ParseCommandActions *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (Token *)this;
  poVar1 = std::operator<<((ostream *)&std::cerr,"actOnBindingDecl");
  poVar1 = std::operator<<(poVar1,"(/*Name=*/");
  poVar1 = std::operator<<(poVar1,"\"");
  escapedString_abi_cxx11_(&local_40,value_local);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"\", ");
  poVar1 = std::operator<<(poVar1,"/*Value=*/\"");
  escapedString_abi_cxx11_(&local_60,local_20);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

virtual void actOnBindingDecl(const ninja::Token& name,
                                const ninja::Token& value) override {
    std::cerr << __FUNCTION__ << "(/*Name=*/"
              << "\"" << escapedString(name) << "\", "
              << "/*Value=*/\"" << escapedString(value) << "\")\n";
  }